

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

QString * QMakeEvaluator::quoteValue(QString *__return_storage_ptr__,ProString *val)

{
  char16_t a;
  int iVar1;
  uint uVar2;
  bool bVar3;
  char16_t *pcVar4;
  storage_type *psVar5;
  ulong uVar6;
  QChar QVar7;
  char *data;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QByteArrayView QVar10;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::reserve(__return_storage_ptr__,(long)val->m_length);
  pcVar4 = (val->m_string).d.ptr;
  if (pcVar4 == (char16_t *)0x0) {
    pcVar4 = (char16_t *)&QString::_empty;
  }
  iVar1 = val->m_offset;
  uVar2 = val->m_length;
  uVar8 = 0;
  bVar9 = uVar2 == 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar8;
  }
  bVar3 = false;
  do {
    QVar7.ucs = (char16_t)__return_storage_ptr__;
    if (uVar6 == uVar8) {
      if (bVar3) {
        QString::append(QVar7);
      }
      if (bVar9) {
        QString::prepend(__return_storage_ptr__,(QChar)0x22);
        QString::append(QVar7);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    a = pcVar4[(long)iVar1 + uVar8];
    if ((ushort)a < 0x20) {
      if (!bVar3) {
        QtPrivate::lengthHelperPointer<char>("$$escape_expand(");
        QString::append((QLatin1String *)__return_storage_ptr__);
        bVar3 = true;
      }
      if (a == L'\t') {
        data = "\\\\t";
        goto LAB_001e4df7;
      }
      if (a == L'\n') {
        data = "\\\\n";
        goto LAB_001e4df7;
      }
      if (a == L'\r') {
        data = "\\\\r";
        goto LAB_001e4df7;
      }
      psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("\\\\x%1",6);
      QVar10.m_data = psVar5;
      QVar10.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar10);
      QString::arg<unsigned_short,_true>
                ((QString *)&local_50,(QString *)&local_68,a,2,0x10,(QChar)0x30);
      QString::append((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      goto LAB_001e4e0d;
    }
    if (bVar3) {
      QString::append(QVar7);
      bVar3 = false;
    }
    switch(a) {
    case L' ':
      bVar9 = true;
    case L'!':
    case L'%':
    case L'&':
      goto switchD_001e4d21_caseD_21;
    case L'\"':
      data = "\\\"";
      break;
    case L'#':
      data = "$${LITERAL_HASH}";
      break;
    case L'$':
      data = "\\$";
      break;
    case L'\'':
      data = "\\\'";
      break;
    default:
      if (a == L'\\') {
        data = "\\\\";
        break;
      }
      goto switchD_001e4d21_caseD_21;
    }
LAB_001e4df7:
    QtPrivate::lengthHelperPointer<char>(data);
    QString::append((QLatin1String *)__return_storage_ptr__);
LAB_001e4e0d:
    uVar8 = uVar8 + 1;
  } while( true );
switchD_001e4d21_caseD_21:
  QString::append(QVar7);
  goto LAB_001e4e0d;
}

Assistant:

QString
QMakeEvaluator::quoteValue(const ProString &val)
{
    QString ret;
    ret.reserve(val.size());
    const QChar *chars = val.constData();
    bool quote = val.isEmpty();
    bool escaping = false;
    for (int i = 0, l = val.size(); i < l; i++) {
        QChar c = chars[i];
        ushort uc = c.unicode();
        if (uc < 32) {
            if (!escaping) {
                escaping = true;
                ret += QLatin1String("$$escape_expand(");
            }
            switch (uc) {
            case '\r':
                ret += QLatin1String("\\\\r");
                break;
            case '\n':
                ret += QLatin1String("\\\\n");
                break;
            case '\t':
                ret += QLatin1String("\\\\t");
                break;
            default:
                ret += QString::fromLatin1("\\\\x%1").arg(uc, 2, 16, QLatin1Char('0'));
                break;
            }
        } else {
            if (escaping) {
                escaping = false;
                ret += QLatin1Char(')');
            }
            switch (uc) {
            case '\\':
                ret += QLatin1String("\\\\");
                break;
            case '"':
                ret += QLatin1String("\\\"");
                break;
            case '\'':
                ret += QLatin1String("\\'");
                break;
            case '$':
                ret += QLatin1String("\\$");
                break;
            case '#':
                ret += QLatin1String("$${LITERAL_HASH}");
                break;
            case 32:
                quote = true;
                Q_FALLTHROUGH();
            default:
                ret += c;
                break;
            }
        }
    }
    if (escaping)
        ret += QLatin1Char(')');
    if (quote) {
        ret.prepend(QLatin1Char('"'));
        ret.append(QLatin1Char('"'));
    }
    return ret;
}